

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

uint64_t bssl::dtls_aead_sequence(SSL *ssl,DTLSRecordNumber num)

{
  uint16_t uVar1;
  uint64_t uVar2;
  SSL *ssl_local;
  DTLSRecordNumber num_local;
  
  ssl_local = (SSL *)num.combined_;
  if ((ssl->s3->version != 0) && (uVar1 = ssl_protocol_version(ssl), 0x303 < uVar1)) {
    uVar2 = DTLSRecordNumber::sequence((DTLSRecordNumber *)&ssl_local);
    return uVar2;
  }
  uVar2 = DTLSRecordNumber::combined((DTLSRecordNumber *)&ssl_local);
  return uVar2;
}

Assistant:

static uint64_t dtls_aead_sequence(const SSL *ssl, DTLSRecordNumber num) {
  // DTLS 1.3 uses the sequence number with the AEAD, while DTLS 1.2 uses the
  // combined value. If the version is not known, the epoch is unencrypted and
  // the value is ignored.
  return (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION)
             ? num.sequence()
             : num.combined();
}